

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

string * __thiscall
CppGenerator::outputFinalRegTupleString_abi_cxx11_
          (CppGenerator *this,AggregateIndexes *idx,size_t numOfAggs,bitset<7UL> *increasing,
          size_t stringOffset)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 uVar5;
  ulong uVar6;
  ulong in_RCX;
  long in_RDX;
  string *in_RDI;
  size_t k_5;
  size_t k_4;
  size_t k_3;
  string aggString_1;
  size_t aggID;
  size_t i;
  string k_2;
  string k_1;
  string k;
  string aggString;
  string aggIDString;
  string *outString;
  undefined2 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9fa;
  byte in_stack_fffffffffffff9fb;
  undefined1 in_stack_fffffffffffff9fc;
  byte in_stack_fffffffffffff9fd;
  undefined1 in_stack_fffffffffffff9fe;
  byte in_stack_fffffffffffff9ff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa09;
  undefined1 in_stack_fffffffffffffa0a;
  undefined1 in_stack_fffffffffffffa0b;
  undefined1 in_stack_fffffffffffffa0c;
  undefined1 in_stack_fffffffffffffa0d;
  undefined1 in_stack_fffffffffffffa0e;
  undefined1 in_stack_fffffffffffffa0f;
  string *__rhs;
  CppGenerator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa48;
  string local_5a0 [32];
  string local_580 [32];
  long local_560;
  reference local_558;
  string local_548 [32];
  string local_528 [32];
  string local_508 [32];
  long local_4e8;
  reference local_4e0;
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  long local_470;
  reference local_468;
  undefined1 local_451 [33];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  long local_350;
  ulong local_348;
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  reference local_2e0;
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  reference local_270;
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  reference local_200;
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [54];
  undefined1 local_31;
  ulong local_20;
  undefined8 local_18;
  
  local_31 = 0;
  this_00 = (CppGenerator *)&stack0xffffffffffffffce;
  __rhs = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__rhs,"",(allocator *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffce);
  if (local_20 < 3) {
    for (local_348 = 0; local_348 < local_20 + 1; local_348 = local_348 + 1) {
      local_350 = *(long *)(local_18 + 0x28);
      uVar5 = std::bitset<7UL>::operator[]
                        ((bitset<7UL> *)in_stack_fffffffffffffa00,
                         CONCAT17(in_stack_fffffffffffff9ff,
                                  CONCAT16(in_stack_fffffffffffff9fe,
                                           CONCAT15(in_stack_fffffffffffff9fd,
                                                    CONCAT14(in_stack_fffffffffffff9fc,
                                                             CONCAT13(in_stack_fffffffffffff9fb,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff9fa,
                                                  in_stack_fffffffffffff9f8)))))));
      if ((bool)uVar5) {
        local_350 = local_348 + local_350;
      }
      offset_abi_cxx11_(this_00,(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa0f,
                              CONCAT16(in_stack_fffffffffffffa0e,
                                       CONCAT15(in_stack_fffffffffffffa0d,
                                                CONCAT14(in_stack_fffffffffffffa0c,
                                                         CONCAT13(in_stack_fffffffffffffa0b,
                                                                  CONCAT12(in_stack_fffffffffffffa0a
                                                                           ,CONCAT11(uVar5,
                                                  in_stack_fffffffffffffa08))))))),
                     (char *)in_stack_fffffffffffffa00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa0f,
                              CONCAT16(in_stack_fffffffffffffa0e,
                                       CONCAT15(in_stack_fffffffffffffa0d,
                                                CONCAT14(in_stack_fffffffffffffa0c,
                                                         CONCAT13(in_stack_fffffffffffffa0b,
                                                                  CONCAT12(in_stack_fffffffffffffa0a
                                                                           ,CONCAT11(uVar5,
                                                  in_stack_fffffffffffffa08))))))),
                     in_stack_fffffffffffffa00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa0f,
                              CONCAT16(in_stack_fffffffffffffa0e,
                                       CONCAT15(in_stack_fffffffffffffa0d,
                                                CONCAT14(in_stack_fffffffffffffa0c,
                                                         CONCAT13(in_stack_fffffffffffffa0b,
                                                                  CONCAT12(in_stack_fffffffffffffa0a
                                                                           ,CONCAT11(uVar5,
                                                  in_stack_fffffffffffffa08))))))),
                     (char *)in_stack_fffffffffffffa00);
      std::__cxx11::to_string((unsigned_long)this_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                     __rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa0f,
                              CONCAT16(in_stack_fffffffffffffa0e,
                                       CONCAT15(in_stack_fffffffffffffa0d,
                                                CONCAT14(in_stack_fffffffffffffa0c,
                                                         CONCAT13(in_stack_fffffffffffffa0b,
                                                                  CONCAT12(in_stack_fffffffffffffa0a
                                                                           ,CONCAT11(uVar5,
                                                  in_stack_fffffffffffffa08))))))),
                     (char *)in_stack_fffffffffffffa00);
      std::__cxx11::string::operator+=((string *)__rhs,local_370);
      std::__cxx11::string::~string(local_370);
      std::__cxx11::string::~string(local_390);
      std::__cxx11::string::~string(local_430);
      std::__cxx11::string::~string(local_3b0);
      std::__cxx11::string::~string(local_3d0);
      std::__cxx11::string::~string(local_3f0);
      std::__cxx11::string::~string(local_410);
      in_stack_fffffffffffffa00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_451;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_451 + 1),"",(allocator *)in_stack_fffffffffffffa00);
      std::allocator<char>::~allocator((allocator<char> *)local_451);
      std::bitset<7UL>::operator[]
                ((bitset<7UL> *)
                 CONCAT17(in_stack_fffffffffffffa0f,
                          CONCAT16(in_stack_fffffffffffffa0e,
                                   CONCAT15(in_stack_fffffffffffffa0d,
                                            CONCAT14(in_stack_fffffffffffffa0c,
                                                     CONCAT13(in_stack_fffffffffffffa0b,
                                                              CONCAT12(in_stack_fffffffffffffa0a,
                                                                       CONCAT11(uVar5,
                                                  in_stack_fffffffffffffa08))))))),
                 (size_t)in_stack_fffffffffffffa00);
      in_stack_fffffffffffff9ff =
           std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffa00);
      std::bitset<7UL>::reference::~reference(&local_468);
      if ((in_stack_fffffffffffff9ff & 1) != 0) {
        local_470 = *(long *)(local_18 + 8);
        in_stack_fffffffffffff9fe =
             std::bitset<7UL>::operator[]
                       ((bitset<7UL> *)in_stack_fffffffffffffa00,
                        CONCAT17(in_stack_fffffffffffff9ff,
                                 CONCAT16(in_stack_fffffffffffff9fe,
                                          CONCAT15(in_stack_fffffffffffff9fd,
                                                   CONCAT14(in_stack_fffffffffffff9fc,
                                                            CONCAT13(in_stack_fffffffffffff9fb,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff9fa,
                                                  in_stack_fffffffffffff9f8)))))));
        if ((bool)in_stack_fffffffffffff9fe) {
          local_470 = local_348 + local_470;
        }
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((char *)CONCAT17(in_stack_fffffffffffffa0f,
                                        CONCAT16(in_stack_fffffffffffffa0e,
                                                 CONCAT15(in_stack_fffffffffffffa0d,
                                                          CONCAT14(in_stack_fffffffffffffa0c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffa0b,
                                                  CONCAT12(in_stack_fffffffffffffa0a,
                                                           CONCAT11(uVar5,in_stack_fffffffffffffa08)
                                                          )))))),in_stack_fffffffffffffa00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffa0f,
                                CONCAT16(in_stack_fffffffffffffa0e,
                                         CONCAT15(in_stack_fffffffffffffa0d,
                                                  CONCAT14(in_stack_fffffffffffffa0c,
                                                           CONCAT13(in_stack_fffffffffffffa0b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffa0a,
                                                  CONCAT11(uVar5,in_stack_fffffffffffffa08))))))),
                       (char *)in_stack_fffffffffffffa00);
        std::__cxx11::string::operator+=((string *)(local_451 + 1),local_490);
        std::__cxx11::string::~string(local_490);
        std::__cxx11::string::~string(local_4b0);
        std::__cxx11::string::~string(local_4d0);
      }
      std::bitset<7UL>::operator[]
                ((bitset<7UL> *)
                 CONCAT17(in_stack_fffffffffffffa0f,
                          CONCAT16(in_stack_fffffffffffffa0e,
                                   CONCAT15(in_stack_fffffffffffffa0d,
                                            CONCAT14(in_stack_fffffffffffffa0c,
                                                     CONCAT13(in_stack_fffffffffffffa0b,
                                                              CONCAT12(in_stack_fffffffffffffa0a,
                                                                       CONCAT11(uVar5,
                                                  in_stack_fffffffffffffa08))))))),
                 (size_t)in_stack_fffffffffffffa00);
      in_stack_fffffffffffff9fd =
           std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffa00);
      std::bitset<7UL>::reference::~reference(&local_4e0);
      if ((in_stack_fffffffffffff9fd & 1) != 0) {
        local_4e8 = *(long *)(local_18 + 0x10);
        in_stack_fffffffffffff9fc =
             std::bitset<7UL>::operator[]
                       ((bitset<7UL> *)in_stack_fffffffffffffa00,
                        CONCAT17(in_stack_fffffffffffff9ff,
                                 CONCAT16(in_stack_fffffffffffff9fe,
                                          CONCAT15(in_stack_fffffffffffff9fd,
                                                   CONCAT14(in_stack_fffffffffffff9fc,
                                                            CONCAT13(in_stack_fffffffffffff9fb,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff9fa,
                                                  in_stack_fffffffffffff9f8)))))));
        if ((bool)in_stack_fffffffffffff9fc) {
          local_4e8 = local_348 + local_4e8;
        }
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((char *)CONCAT17(in_stack_fffffffffffffa0f,
                                        CONCAT16(in_stack_fffffffffffffa0e,
                                                 CONCAT15(in_stack_fffffffffffffa0d,
                                                          CONCAT14(in_stack_fffffffffffffa0c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffa0b,
                                                  CONCAT12(in_stack_fffffffffffffa0a,
                                                           CONCAT11(uVar5,in_stack_fffffffffffffa08)
                                                          )))))),in_stack_fffffffffffffa00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffa0f,
                                CONCAT16(in_stack_fffffffffffffa0e,
                                         CONCAT15(in_stack_fffffffffffffa0d,
                                                  CONCAT14(in_stack_fffffffffffffa0c,
                                                           CONCAT13(in_stack_fffffffffffffa0b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffa0a,
                                                  CONCAT11(uVar5,in_stack_fffffffffffffa08))))))),
                       (char *)in_stack_fffffffffffffa00);
        std::__cxx11::string::operator+=((string *)(local_451 + 1),local_508);
        std::__cxx11::string::~string(local_508);
        std::__cxx11::string::~string(local_528);
        std::__cxx11::string::~string(local_548);
      }
      std::bitset<7UL>::operator[]
                ((bitset<7UL> *)
                 CONCAT17(in_stack_fffffffffffffa0f,
                          CONCAT16(in_stack_fffffffffffffa0e,
                                   CONCAT15(in_stack_fffffffffffffa0d,
                                            CONCAT14(in_stack_fffffffffffffa0c,
                                                     CONCAT13(in_stack_fffffffffffffa0b,
                                                              CONCAT12(in_stack_fffffffffffffa0a,
                                                                       CONCAT11(uVar5,
                                                  in_stack_fffffffffffffa08))))))),
                 (size_t)in_stack_fffffffffffffa00);
      in_stack_fffffffffffff9fb =
           std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffa00);
      std::bitset<7UL>::reference::~reference(&local_558);
      if ((in_stack_fffffffffffff9fb & 1) != 0) {
        local_560 = *(long *)(local_18 + 0x18);
        in_stack_fffffffffffff9fa =
             std::bitset<7UL>::operator[]
                       ((bitset<7UL> *)in_stack_fffffffffffffa00,
                        CONCAT17(in_stack_fffffffffffff9ff,
                                 CONCAT16(in_stack_fffffffffffff9fe,
                                          CONCAT15(in_stack_fffffffffffff9fd,
                                                   CONCAT14(in_stack_fffffffffffff9fc,
                                                            CONCAT13(in_stack_fffffffffffff9fb,
                                                                     CONCAT12(
                                                  in_stack_fffffffffffff9fa,
                                                  in_stack_fffffffffffff9f8)))))));
        if ((bool)in_stack_fffffffffffff9fa) {
          local_560 = local_348 + local_560;
        }
        std::__cxx11::to_string((unsigned_long)this_00);
        std::operator+((char *)CONCAT17(in_stack_fffffffffffffa0f,
                                        CONCAT16(in_stack_fffffffffffffa0e,
                                                 CONCAT15(in_stack_fffffffffffffa0d,
                                                          CONCAT14(in_stack_fffffffffffffa0c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffa0b,
                                                  CONCAT12(in_stack_fffffffffffffa0a,
                                                           CONCAT11(uVar5,in_stack_fffffffffffffa08)
                                                          )))))),in_stack_fffffffffffffa00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffa0f,
                                CONCAT16(in_stack_fffffffffffffa0e,
                                         CONCAT15(in_stack_fffffffffffffa0d,
                                                  CONCAT14(in_stack_fffffffffffffa0c,
                                                           CONCAT13(in_stack_fffffffffffffa0b,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffa0a,
                                                  CONCAT11(uVar5,in_stack_fffffffffffffa08))))))),
                       (char *)in_stack_fffffffffffffa00);
        std::__cxx11::string::operator+=((string *)(local_451 + 1),local_580);
        std::__cxx11::string::~string(local_580);
        std::__cxx11::string::~string(local_5a0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffa40);
      }
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        std::__cxx11::string::pop_back();
      }
      else {
        std::__cxx11::string::operator=((string *)(local_451 + 1),"1");
      }
      std::__cxx11::string::operator+=((string *)__rhs,(string *)(local_451 + 1));
      std::__cxx11::string::operator+=((string *)__rhs,";\n");
      std::__cxx11::string::~string((string *)(local_451 + 1));
    }
  }
  else {
    offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa0f,
                            CONCAT16(in_stack_fffffffffffffa0e,
                                     CONCAT15(in_stack_fffffffffffffa0d,
                                              CONCAT14(in_stack_fffffffffffffa0c,
                                                       CONCAT13(in_stack_fffffffffffffa0b,
                                                                CONCAT12(in_stack_fffffffffffffa0a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffa09,
                                                  in_stack_fffffffffffffa08))))))),
                   (char *)in_stack_fffffffffffffa00);
    std::__cxx11::to_string((unsigned_long)this_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa0f,
                            CONCAT16(in_stack_fffffffffffffa0e,
                                     CONCAT15(in_stack_fffffffffffffa0d,
                                              CONCAT14(in_stack_fffffffffffffa0c,
                                                       CONCAT13(in_stack_fffffffffffffa0b,
                                                                CONCAT12(in_stack_fffffffffffffa0a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffa09,
                                                  in_stack_fffffffffffffa08))))))),
                   (char *)in_stack_fffffffffffffa00);
    std::__cxx11::string::operator+=((string *)__rhs,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::to_string((unsigned_long)this_00);
    bVar1 = std::bitset<7UL>::operator[]
                      ((bitset<7UL> *)in_stack_fffffffffffffa00,
                       CONCAT17(in_stack_fffffffffffff9ff,
                                CONCAT16(in_stack_fffffffffffff9fe,
                                         CONCAT15(in_stack_fffffffffffff9fd,
                                                  CONCAT14(in_stack_fffffffffffff9fc,
                                                           CONCAT13(in_stack_fffffffffffff9fb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffff9fa,
                                                  in_stack_fffffffffffff9f8)))))));
    if (bVar1) {
      std::__cxx11::string::operator+=(local_108,"+i");
    }
    offset_abi_cxx11_(this_00,(size_t)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa0f,
                            CONCAT16(in_stack_fffffffffffffa0e,
                                     CONCAT15(in_stack_fffffffffffffa0d,
                                              CONCAT14(in_stack_fffffffffffffa0c,
                                                       CONCAT13(in_stack_fffffffffffffa0b,
                                                                CONCAT12(in_stack_fffffffffffffa0a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffa09,
                                                  in_stack_fffffffffffffa08))))))),
                   (char *)in_stack_fffffffffffffa00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa0f,
                            CONCAT16(in_stack_fffffffffffffa0e,
                                     CONCAT15(in_stack_fffffffffffffa0d,
                                              CONCAT14(in_stack_fffffffffffffa0c,
                                                       CONCAT13(in_stack_fffffffffffffa0b,
                                                                CONCAT12(in_stack_fffffffffffffa0a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffa09,
                                                  in_stack_fffffffffffffa08))))))),
                   in_stack_fffffffffffffa00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa0f,
                            CONCAT16(in_stack_fffffffffffffa0e,
                                     CONCAT15(in_stack_fffffffffffffa0d,
                                              CONCAT14(in_stack_fffffffffffffa0c,
                                                       CONCAT13(in_stack_fffffffffffffa0b,
                                                                CONCAT12(in_stack_fffffffffffffa0a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffa09,
                                                  in_stack_fffffffffffffa08))))))),
                   (char *)in_stack_fffffffffffffa00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa0f,
                            CONCAT16(in_stack_fffffffffffffa0e,
                                     CONCAT15(in_stack_fffffffffffffa0d,
                                              CONCAT14(in_stack_fffffffffffffa0c,
                                                       CONCAT13(in_stack_fffffffffffffa0b,
                                                                CONCAT12(in_stack_fffffffffffffa0a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffa09,
                                                  in_stack_fffffffffffffa08))))))),
                   in_stack_fffffffffffffa00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa0f,
                            CONCAT16(in_stack_fffffffffffffa0e,
                                     CONCAT15(in_stack_fffffffffffffa0d,
                                              CONCAT14(in_stack_fffffffffffffa0c,
                                                       CONCAT13(in_stack_fffffffffffffa0b,
                                                                CONCAT12(in_stack_fffffffffffffa0a,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffa09,
                                                  in_stack_fffffffffffffa08))))))),
                   (char *)in_stack_fffffffffffffa00);
    std::__cxx11::string::operator+=((string *)__rhs,local_128);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"",&local_1e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    std::bitset<7UL>::operator[]
              ((bitset<7UL> *)
               CONCAT17(in_stack_fffffffffffffa0f,
                        CONCAT16(in_stack_fffffffffffffa0e,
                                 CONCAT15(in_stack_fffffffffffffa0d,
                                          CONCAT14(in_stack_fffffffffffffa0c,
                                                   CONCAT13(in_stack_fffffffffffffa0b,
                                                            CONCAT12(in_stack_fffffffffffffa0a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffa09,
                                                  in_stack_fffffffffffffa08))))))),
               (size_t)in_stack_fffffffffffffa00);
    bVar2 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffa00);
    std::bitset<7UL>::reference::~reference(&local_200);
    if ((bVar2 & 1) != 0) {
      std::__cxx11::to_string((unsigned_long)this_00);
      in_stack_fffffffffffffa0e =
           std::bitset<7UL>::operator[]
                     ((bitset<7UL> *)in_stack_fffffffffffffa00,
                      CONCAT17(in_stack_fffffffffffff9ff,
                               CONCAT16(in_stack_fffffffffffff9fe,
                                        CONCAT15(in_stack_fffffffffffff9fd,
                                                 CONCAT14(in_stack_fffffffffffff9fc,
                                                          CONCAT13(in_stack_fffffffffffff9fb,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffff9fa,
                                                  in_stack_fffffffffffff9f8)))))));
      if ((bool)in_stack_fffffffffffffa0e) {
        std::__cxx11::string::operator+=(local_220,"+i");
      }
      std::operator+(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffa0e,
                                             CONCAT15(in_stack_fffffffffffffa0d,
                                                      CONCAT14(in_stack_fffffffffffffa0c,
                                                               CONCAT13(in_stack_fffffffffffffa0b,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffa0a,
                                                  CONCAT11(in_stack_fffffffffffffa09,
                                                           in_stack_fffffffffffffa08))))))),
                     (char *)in_stack_fffffffffffffa00);
      std::__cxx11::string::operator+=(local_1e8,local_240);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_220);
    }
    std::bitset<7UL>::operator[]
              ((bitset<7UL> *)
               CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffa0e,
                                       CONCAT15(in_stack_fffffffffffffa0d,
                                                CONCAT14(in_stack_fffffffffffffa0c,
                                                         CONCAT13(in_stack_fffffffffffffa0b,
                                                                  CONCAT12(in_stack_fffffffffffffa0a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffa09,
                                                  in_stack_fffffffffffffa08))))))),
               (size_t)in_stack_fffffffffffffa00);
    bVar3 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffa00);
    std::bitset<7UL>::reference::~reference(&local_270);
    if ((bVar3 & 1) != 0) {
      std::__cxx11::to_string((unsigned_long)this_00);
      in_stack_fffffffffffffa0c =
           std::bitset<7UL>::operator[]
                     ((bitset<7UL> *)in_stack_fffffffffffffa00,
                      CONCAT17(in_stack_fffffffffffff9ff,
                               CONCAT16(in_stack_fffffffffffff9fe,
                                        CONCAT15(in_stack_fffffffffffff9fd,
                                                 CONCAT14(in_stack_fffffffffffff9fc,
                                                          CONCAT13(in_stack_fffffffffffff9fb,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffff9fa,
                                                  in_stack_fffffffffffff9f8)))))));
      if ((bool)in_stack_fffffffffffffa0c) {
        std::__cxx11::string::operator+=(local_290,"+i");
      }
      std::operator+(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffa0e,
                                             CONCAT15(bVar3,CONCAT14(in_stack_fffffffffffffa0c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffa0b,
                                                  CONCAT12(in_stack_fffffffffffffa0a,
                                                           CONCAT11(in_stack_fffffffffffffa09,
                                                                    in_stack_fffffffffffffa08)))))))
                     ,(char *)in_stack_fffffffffffffa00);
      std::__cxx11::string::operator+=(local_1e8,local_2b0);
      std::__cxx11::string::~string(local_2b0);
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::~string(local_290);
    }
    std::bitset<7UL>::operator[]
              ((bitset<7UL> *)
               CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffa0e,
                                       CONCAT15(bVar3,CONCAT14(in_stack_fffffffffffffa0c,
                                                               CONCAT13(in_stack_fffffffffffffa0b,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffa0a,
                                                  CONCAT11(in_stack_fffffffffffffa09,
                                                           in_stack_fffffffffffffa08))))))),
               (size_t)in_stack_fffffffffffffa00);
    bVar4 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffa00);
    std::bitset<7UL>::reference::~reference(&local_2e0);
    if ((bVar4 & 1) != 0) {
      std::__cxx11::to_string((unsigned_long)this_00);
      uVar5 = std::bitset<7UL>::operator[]
                        ((bitset<7UL> *)in_stack_fffffffffffffa00,
                         CONCAT17(in_stack_fffffffffffff9ff,
                                  CONCAT16(in_stack_fffffffffffff9fe,
                                           CONCAT15(in_stack_fffffffffffff9fd,
                                                    CONCAT14(in_stack_fffffffffffff9fc,
                                                             CONCAT13(in_stack_fffffffffffff9fb,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff9fa,
                                                  in_stack_fffffffffffff9f8)))))));
      if ((bool)uVar5) {
        std::__cxx11::string::operator+=(local_300,"+i");
      }
      std::operator+(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffa0e,
                                             CONCAT15(bVar3,CONCAT14(in_stack_fffffffffffffa0c,
                                                                     CONCAT13(bVar4,CONCAT12(uVar5,
                                                  CONCAT11(in_stack_fffffffffffffa09,
                                                           in_stack_fffffffffffffa08))))))),
                     (char *)in_stack_fffffffffffffa00);
      std::__cxx11::string::operator+=(local_1e8,local_320);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::~string(local_300);
    }
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::pop_back();
    }
    else {
      std::__cxx11::string::operator=(local_1e8,"1*");
    }
    std::__cxx11::string::operator+=((string *)__rhs,local_1e8);
    std::__cxx11::string::operator+=((string *)__rhs,";\n");
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_108);
  }
  return in_RDI;
}

Assistant:

std::string CppGenerator::outputFinalRegTupleString(
    AggregateIndexes& idx, size_t numOfAggs, const std::bitset<7>& increasing,
    size_t stringOffset)
{
    std::string outString = "";
    
    if (numOfAggs > LOOPIFY_THRESHOLD)
    {
        outString += offset(stringOffset)+
            "for (size_t i = 0; i < "+std::to_string(numOfAggs+1)+";++i)\n";

        std::string aggIDString = std::to_string(idx.indexes[4]);
        if (increasing[4])
            aggIDString += "+i";
        
        outString += offset(stringOffset+1)+"aggregates_"+viewName[idx.indexes[3]]+
            "["+aggIDString+"] += ";

        std::string aggString = "";
        if (idx.present[0])
        {
            std::string k = std::to_string(idx.indexes[0]);
            if (increasing[0])
                k += "+i";
            aggString +="aggregateRegister["+k+"]*";
        }

        if (idx.present[1])
        {
            std::string k = std::to_string(idx.indexes[1]);
            if (increasing[1])
                k += "+i";
            aggString +="postRegister["+k+"]*";
        }

        if (idx.present[2])
        {
            std::string k = std::to_string(idx.indexes[2]);
            if (increasing[2])
                k += "+i";
            aggString +="aggregateRegister["+k+"]*";
        }

        if (aggString.empty())
        {
            // std::cout << "aggString is empty - compressed!\n";
            aggString = "1*";
        }
        else
            aggString.pop_back();
        
        outString += aggString;
        outString += ";\n";
    }
    else
    {
        // Print out all aggregates individually
        for (size_t i = 0; i < numOfAggs+1; ++i)
        {
            size_t aggID = idx.indexes[4];
            if (increasing[4])
                aggID += i;
        
            // We use a mapping to the correct index
            outString += offset(stringOffset)+"aggregates_"+viewName[idx.indexes[3]]+
                "["+std::to_string(aggID)+"] += ";

            std::string aggString = "";
            
            if (idx.present[0])
            {
                size_t k = idx.indexes[0];
                if (increasing[0])
                    k += i;
                aggString +="aggregateRegister["+std::to_string(k)+"]*";
            }
            
            if (idx.present[1])
            {
                size_t k = idx.indexes[1];
                if (increasing[1])
                    k += i;
                aggString +="postRegister["+std::to_string(k)+"]*";
            }

            if (idx.present[2])
            {
                size_t k = idx.indexes[2];
                if (increasing[2])
                    k += i;
                aggString +="aggregateRegister["+std::to_string(k)+"]*";
            }

            if (aggString.empty())
            {
                // std::cout << "aggString is empty --- non-compressed !\n";
                aggString = "1";
            }
            else
                aggString.pop_back();
        
            outString += aggString;
            outString += ";\n";
        }
    }

    return outString;
}